

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

bool __thiscall
soul::ResolutionPass::ModuleInstanceResolver::validateSpecialisationParam
          (ModuleInstanceResolver *this,ASTObject *param,bool shouldIgnoreErrors)

{
  bool bVar1;
  UsingDeclaration *pUVar2;
  ProcessorAliasDeclaration *pPVar3;
  VariableDeclaration *pVVar4;
  NamespaceAliasDeclaration *pNVar5;
  Expression *pEVar6;
  CompileMessage local_148;
  pool_ptr<soul::AST::Namespace> local_110;
  pool_ptr<soul::AST::NamespaceAliasDeclaration> local_108;
  pool_ptr<soul::AST::NamespaceAliasDeclaration> n;
  pool_ptr<soul::AST::VariableDeclaration> local_c8;
  pool_ptr<soul::AST::VariableDeclaration> v;
  pool_ptr<soul::AST::ProcessorBase> local_88;
  pool_ptr<soul::AST::ProcessorAliasDeclaration> local_80;
  pool_ptr<soul::AST::ProcessorAliasDeclaration> pa;
  pool_ptr<soul::AST::UsingDeclaration> local_30;
  pool_ptr<soul::AST::UsingDeclaration> u;
  bool shouldIgnoreErrors_local;
  ASTObject *param_local;
  ModuleInstanceResolver *this_local;
  
  u.object._7_1_ = shouldIgnoreErrors;
  cast<soul::AST::UsingDeclaration,soul::AST::ASTObject>((soul *)&local_30,param);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_30);
  if (bVar1) {
    pUVar2 = pool_ptr<soul::AST::UsingDeclaration>::operator->(&local_30);
    bVar1 = pool_ptr<soul::AST::Expression>::operator==(&pUVar2->targetType,(void *)0x0);
    if (bVar1) {
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      pUVar2 = pool_ptr<soul::AST::UsingDeclaration>::operator->(&local_30);
      pEVar6 = pool_ptr<soul::AST::Expression>::operator*(&pUVar2->targetType);
      bVar1 = AST::isResolvedAsType(pEVar6);
      if (bVar1) {
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        if ((u.object._7_1_ & 1) == 0) {
          pUVar2 = pool_ptr<soul::AST::UsingDeclaration>::operator->(&local_30);
          pEVar6 = pool_ptr<soul::AST::Expression>::operator->(&pUVar2->targetType);
          Errors::expectedType<>();
          AST::Context::throwError
                    (&(pEVar6->super_Statement).super_ASTObject.context,(CompileMessage *)&pa,false)
          ;
        }
        this_local._7_1_ = 0;
        bVar1 = true;
      }
    }
  }
  else {
    cast<soul::AST::ProcessorAliasDeclaration,soul::AST::ASTObject>((soul *)&local_80,param);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_80);
    if (bVar1) {
      pPVar3 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_80);
      bVar1 = pool_ptr<soul::AST::Expression>::operator==(&pPVar3->targetProcessor,(void *)0x0);
      if (bVar1) {
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        pPVar3 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_80);
        pEVar6 = pool_ptr<soul::AST::Expression>::operator->(&pPVar3->targetProcessor);
        (*(pEVar6->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_88);
        pPVar3 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_80);
        (pPVar3->resolvedProcessor).object = local_88.object;
        pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_88);
        pPVar3 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_80);
        bVar1 = pool_ptr<soul::AST::ProcessorBase>::operator!=
                          (&pPVar3->resolvedProcessor,(void *)0x0);
        if (bVar1) {
          this_local._7_1_ = 1;
          bVar1 = true;
        }
        else {
          if ((u.object._7_1_ & 1) == 0) {
            pPVar3 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_80);
            pEVar6 = pool_ptr<soul::AST::Expression>::operator->(&pPVar3->targetProcessor);
            Errors::expectedProcessorName<>();
            AST::Context::throwError
                      (&(pEVar6->super_Statement).super_ASTObject.context,(CompileMessage *)&v,false
                      );
          }
          this_local._7_1_ = 0;
          bVar1 = true;
        }
      }
    }
    else {
      cast<soul::AST::VariableDeclaration,soul::AST::ASTObject>((soul *)&local_c8,param);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_c8);
      if (bVar1) {
        pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_c8);
        bVar1 = pool_ptr<soul::AST::Expression>::operator==(&pVVar4->initialValue,(void *)0x0);
        if (bVar1) {
          this_local._7_1_ = 1;
          bVar1 = true;
        }
        else {
          pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_c8);
          pEVar6 = pool_ptr<soul::AST::Expression>::operator*(&pVVar4->initialValue);
          bVar1 = AST::isResolvedAsValue(pEVar6);
          if (bVar1) {
            this_local._7_1_ = 1;
            bVar1 = true;
          }
          else {
            if ((u.object._7_1_ & 1) == 0) {
              pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_c8);
              pEVar6 = pool_ptr<soul::AST::Expression>::operator->(&pVVar4->initialValue);
              Errors::expectedValue<>();
              AST::Context::throwError
                        (&(pEVar6->super_Statement).super_ASTObject.context,(CompileMessage *)&n,
                         false);
            }
            this_local._7_1_ = 0;
            bVar1 = true;
          }
        }
      }
      else {
        cast<soul::AST::NamespaceAliasDeclaration,soul::AST::ASTObject>((soul *)&local_108,param);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_108);
        if (bVar1) {
          pNVar5 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_108);
          bVar1 = pool_ptr<soul::AST::Expression>::operator==(&pNVar5->targetNamespace,(void *)0x0);
          if (bVar1) {
            this_local._7_1_ = 1;
            bVar1 = true;
          }
          else {
            pNVar5 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_108);
            pEVar6 = pool_ptr<soul::AST::Expression>::operator->(&pNVar5->targetNamespace);
            (*(pEVar6->super_Statement).super_ASTObject._vptr_ASTObject[7])(&local_110);
            pNVar5 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_108);
            (pNVar5->resolvedNamespace).object = local_110.object;
            pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_110);
            pNVar5 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_108);
            bVar1 = pool_ptr<soul::AST::Namespace>::operator!=
                              (&pNVar5->resolvedNamespace,(void *)0x0);
            if (bVar1) {
              this_local._7_1_ = 1;
              bVar1 = true;
            }
            else {
              if ((u.object._7_1_ & 1) == 0) {
                pNVar5 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_108);
                pEVar6 = pool_ptr<soul::AST::Expression>::operator->(&pNVar5->targetNamespace);
                Errors::expectedNamespaceName<>();
                AST::Context::throwError
                          (&(pEVar6->super_Statement).super_ASTObject.context,&local_148,false);
              }
              this_local._7_1_ = 0;
              bVar1 = true;
            }
          }
        }
        else {
          bVar1 = false;
        }
        pool_ptr<soul::AST::NamespaceAliasDeclaration>::~pool_ptr(&local_108);
        if (!bVar1) {
          bVar1 = false;
        }
      }
      pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr(&local_c8);
      if (!bVar1) {
        bVar1 = false;
      }
    }
    pool_ptr<soul::AST::ProcessorAliasDeclaration>::~pool_ptr(&local_80);
    if (!bVar1) {
      bVar1 = false;
    }
  }
  pool_ptr<soul::AST::UsingDeclaration>::~pool_ptr(&local_30);
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool validateSpecialisationParam (AST::ASTObject& param, bool shouldIgnoreErrors) const
        {
            if (auto u = cast<AST::UsingDeclaration> (param))
            {
                if (u->targetType == nullptr)
                    return true;

                if (AST::isResolvedAsType (*u->targetType))
                    return true;

                if (! shouldIgnoreErrors)
                    u->targetType->context.throwError (Errors::expectedType());

                return false;
            }
            else if (auto pa = cast<AST::ProcessorAliasDeclaration> (param))
            {
                if (pa->targetProcessor == nullptr)
                    return true;

                pa->resolvedProcessor = pa->targetProcessor->getAsProcessor();

                if (pa->resolvedProcessor != nullptr)
                    return true;

                if (! shouldIgnoreErrors)
                    pa->targetProcessor->context.throwError (Errors::expectedProcessorName());

                return false;
            }
            else if (auto v = cast<AST::VariableDeclaration> (param))
            {
                if (v->initialValue == nullptr)
                    return true;

                if (AST::isResolvedAsValue (*v->initialValue))
                    return true;

                if (! shouldIgnoreErrors)
                    v->initialValue->context.throwError (Errors::expectedValue());

                return false;
            }
            else if (auto n = cast<AST::NamespaceAliasDeclaration> (param))
            {
                if (n->targetNamespace == nullptr)
                    return true;

                n->resolvedNamespace = n->targetNamespace->getAsNamespace();

                if (n->resolvedNamespace != nullptr)
                    return true;

                if (! shouldIgnoreErrors)
                    n->targetNamespace->context.throwError (Errors::expectedNamespaceName());

                return false;
            }

            return false;
        }